

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_db27f7::TestSignatureChecker::CheckECDSASignature
          (TestSignatureChecker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sig,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey,CScript *scriptcode,
          SigVersion sigversion)

{
  pointer __s1;
  pointer puVar1;
  int iVar2;
  const_iterator cVar3;
  size_t __n;
  long in_FS_OFFSET;
  bool bVar4;
  CPubKey pk;
  CPubKey local_59;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::Set<unsigned_char_const*>
            (&local_59,
             (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  if ((local_59.vch[0] & 0xfe) != 2) {
    bVar4 = false;
    if ((7 < local_59.vch[0]) || (bVar4 = false, (0xd0U >> (local_59.vch[0] & 0x1f) & 1) == 0))
    goto LAB_0047d7fe;
  }
  cVar3 = std::
          _Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find((_Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)((anonymous_namespace)::g_testdata + 0xa8),&local_59);
  if (cVar3._M_node != (_Base_ptr)((anonymous_namespace)::g_testdata + 0xb0)) {
    __s1 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    if (__n == (long)cVar3._M_node[3]._M_left - (long)cVar3._M_node[3]._M_parent) {
      if (puVar1 == __s1) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(__s1,cVar3._M_node[3]._M_parent,__n);
        bVar4 = iVar2 == 0;
      }
      goto LAB_0047d7fe;
    }
  }
  bVar4 = false;
LAB_0047d7fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckECDSASignature(const std::vector<unsigned char>& sig, const std::vector<unsigned char>& pubkey, const CScript& scriptcode, SigVersion sigversion) const override {
        CPubKey pk(pubkey);
        if (!pk.IsValid()) return false;
        // Instead of actually running signature validation, check if the signature matches the precomputed one for this key.
        auto it = g_testdata->signatures.find(pk);
        if (it == g_testdata->signatures.end()) return false;
        return sig == it->second;
    }